

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool Catch::operator<(TestCaseInfo *lhs,TestCaseInfo *rhs)

{
  int iVar1;
  int cmpClassName;
  int cmpName;
  TestCaseInfo *rhs_local;
  TestCaseInfo *lhs_local;
  
  iVar1 = std::__cxx11::string::compare((string *)lhs);
  if (iVar1 == 0) {
    iVar1 = StringRef::compare(&lhs->className,rhs->className);
    if (iVar1 == 0) {
      lhs_local._7_1_ = std::operator<(&lhs->tags,&rhs->tags);
    }
    else {
      lhs_local._7_1_ = iVar1 < 0;
    }
  }
  else {
    lhs_local._7_1_ = iVar1 < 0;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator<( TestCaseInfo const& lhs, TestCaseInfo const& rhs ) {
        // We want to avoid redoing the string comparisons multiple times,
        // so we store the result of a three-way comparison before using
        // it in the actual comparison logic.
        const auto cmpName = lhs.name.compare( rhs.name );
        if ( cmpName != 0 ) {
            return cmpName < 0;
        }
        const auto cmpClassName = lhs.className.compare( rhs.className );
        if ( cmpClassName != 0 ) {
            return cmpClassName < 0;
        }
        return lhs.tags < rhs.tags;
    }